

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitStackSwitch(BinaryInstWriter *this,StackSwitch *curr)

{
  WasmBinaryWriter *this_00;
  BufferWithRandomAccess *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 in_RAX;
  HeapType type;
  size_t in_RCX;
  void *__buf;
  undefined8 local_28;
  
  local_28 = in_RAX;
  bVar2 = wasm::Type::isContinuation(&curr->cont->type);
  if (bVar2) {
    local_28 = CONCAT17(0xe5,(undefined7)local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               (uchar *)((long)&local_28 + 7));
    this_00 = this->parent;
    type = wasm::Type::getHeapType(&curr->cont->type);
    WasmBinaryWriter::writeIndexedHeapType(this_00,type);
    pBVar1 = this->o;
    uVar3 = WasmBinaryWriter::getTagIndex(this->parent,(Name)(curr->tag).super_IString.str);
    local_28 = CONCAT44(local_28._4_4_,uVar3);
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)&local_28,(int)pBVar1,__buf,in_RCX);
    return;
  }
  __assert_fail("curr->cont->type.isContinuation()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                ,0xaa9,"void wasm::BinaryInstWriter::visitStackSwitch(StackSwitch *)");
}

Assistant:

void BinaryInstWriter::visitStackSwitch(StackSwitch* curr) {
  assert(curr->cont->type.isContinuation());
  o << int8_t(BinaryConsts::Switch);
  parent.writeIndexedHeapType(curr->cont->type.getHeapType());
  o << U32LEB(parent.getTagIndex(curr->tag));
}